

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void re2::Regexp::RemoveLeadingString(Regexp *re,int n)

{
  Regexp *this;
  Regexp *that;
  RegexpOp RVar1;
  uint uVar2;
  int iVar3;
  Regexp **ppRVar4;
  ostream *poVar5;
  Regexp *old;
  LogMessage local_1c8;
  Regexp **local_48;
  Regexp **sub;
  Rune rune;
  int d;
  Regexp *stk [4];
  Regexp *pRStack_10;
  int n_local;
  Regexp *re_local;
  
  sub._4_4_ = 0;
  stk[3]._4_4_ = n;
  pRStack_10 = re;
  while (RVar1 = op(pRStack_10), RVar1 == kRegexpConcat) {
    if (sub._4_4_ < 4) {
      *(Regexp **)(&rune + (long)sub._4_4_ * 2) = pRStack_10;
      sub._4_4_ = sub._4_4_ + 1;
    }
    ppRVar4 = Regexp::sub(pRStack_10);
    pRStack_10 = *ppRVar4;
  }
  RVar1 = op(pRStack_10);
  if (RVar1 == kRegexpLiteral) {
    (pRStack_10->field_7).field_0.max_ = 0;
    pRStack_10->op_ = '\x02';
  }
  else {
    RVar1 = op(pRStack_10);
    if (RVar1 == kRegexpLiteralString) {
      if (stk[3]._4_4_ < (pRStack_10->field_7).field_0.max_) {
        if (stk[3]._4_4_ == (pRStack_10->field_7).field_0.max_ + -1) {
          sub._0_4_ = *(int *)((pRStack_10->field_7).field_1.name_ +
                              (long)((pRStack_10->field_7).field_0.max_ + -1) * 4);
          if ((pRStack_10->field_7).the_union_[1] != (void *)0x0) {
            operator_delete__((pRStack_10->field_7).the_union_[1]);
          }
          (pRStack_10->field_7).field_1.name_ = (string *)0x0;
          (pRStack_10->field_7).field_0.max_ = 0;
          (pRStack_10->field_7).field_0.max_ = (int)sub;
          pRStack_10->op_ = '\x03';
        }
        else {
          (pRStack_10->field_7).field_0.max_ = (pRStack_10->field_7).field_0.max_ - stk[3]._4_4_;
          memmove((pRStack_10->field_7).the_union_[1],
                  (pRStack_10->field_7).field_1.name_ + (long)stk[3]._4_4_ * 4,
                  (long)(pRStack_10->field_7).field_0.max_ << 2);
        }
      }
      else {
        if ((pRStack_10->field_7).the_union_[1] != (void *)0x0) {
          operator_delete__((pRStack_10->field_7).the_union_[1]);
        }
        (pRStack_10->field_7).field_1.name_ = (string *)0x0;
        (pRStack_10->field_7).field_0.max_ = 0;
        pRStack_10->op_ = '\x02';
      }
    }
  }
  while (0 < sub._4_4_) {
    this = *(Regexp **)(&rune + (long)(sub._4_4_ + -1) * 2);
    sub._4_4_ = sub._4_4_ + -1;
    local_48 = Regexp::sub(this);
    RVar1 = op(*local_48);
    if (RVar1 == kRegexpEmptyMatch) {
      Decref(*local_48);
      *local_48 = (Regexp *)0x0;
      uVar2 = nsub(this);
      if (uVar2 < 2) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/parse.cc",
                   0x327);
        poVar5 = LogMessage::stream(&local_1c8);
        poVar5 = std::operator<<(poVar5,"Concat of ");
        iVar3 = nsub(this);
        std::ostream::operator<<(poVar5,iVar3);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c8);
        (this->field_5).submany_ = (Regexp **)0x0;
        this->op_ = '\x02';
      }
      else if (uVar2 == 2) {
        that = local_48[1];
        local_48[1] = (Regexp *)0x0;
        Swap(this,that);
        Decref(that);
      }
      else {
        this->nsub_ = this->nsub_ - 1;
        memmove(local_48,local_48 + 1,(ulong)this->nsub_ << 3);
      }
    }
  }
  return;
}

Assistant:

void Regexp::RemoveLeadingString(Regexp* re, int n) {
  // Chase down concats to find first string.
  // For regexps generated by parser, nested concats are
  // flattened except when doing so would overflow the 16-bit
  // limit on the size of a concatenation, so we should never
  // see more than two here.
  Regexp* stk[4];
  int d = 0;
  while (re->op() == kRegexpConcat) {
    if (d < arraysize(stk))
      stk[d++] = re;
    re = re->sub()[0];
  }

  // Remove leading string from re.
  if (re->op() == kRegexpLiteral) {
    re->rune_ = 0;
    re->op_ = kRegexpEmptyMatch;
  } else if (re->op() == kRegexpLiteralString) {
    if (n >= re->nrunes_) {
      delete[] re->runes_;
      re->runes_ = NULL;
      re->nrunes_ = 0;
      re->op_ = kRegexpEmptyMatch;
    } else if (n == re->nrunes_ - 1) {
      Rune rune = re->runes_[re->nrunes_ - 1];
      delete[] re->runes_;
      re->runes_ = NULL;
      re->nrunes_ = 0;
      re->rune_ = rune;
      re->op_ = kRegexpLiteral;
    } else {
      re->nrunes_ -= n;
      memmove(re->runes_, re->runes_ + n, re->nrunes_ * sizeof re->runes_[0]);
    }
  }

  // If re is now empty, concatenations might simplify too.
  while (d-- > 0) {
    re = stk[d];
    Regexp** sub = re->sub();
    if (sub[0]->op() == kRegexpEmptyMatch) {
      sub[0]->Decref();
      sub[0] = NULL;
      // Delete first element of concat.
      switch (re->nsub()) {
        case 0:
        case 1:
          // Impossible.
          LOG(DFATAL) << "Concat of " << re->nsub();
          re->submany_ = NULL;
          re->op_ = kRegexpEmptyMatch;
          break;

        case 2: {
          // Replace re with sub[1].
          Regexp* old = sub[1];
          sub[1] = NULL;
          re->Swap(old);
          old->Decref();
          break;
        }

        default:
          // Slide down.
          re->nsub_--;
          memmove(sub, sub + 1, re->nsub_ * sizeof sub[0]);
          break;
      }
    }
  }
}